

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O0

ProgressPhase
probprime_add_progress_phase(PrimeGenerationPolicy *policy,ProgressReceiver *prog,uint bits)

{
  double dVar1;
  uint uVar2;
  ProgressPhase PVar3;
  double dVar4;
  double cost;
  double prob;
  double winnow_factor;
  double log_2;
  uint bits_local;
  ProgressReceiver *prog_local;
  PrimeGenerationPolicy *policy_local;
  
  dVar1 = *(double *)(&DAT_0016eef0 + (ulong)(bits < 0x20) * 8);
  uVar2 = miller_rabin_checks_needed(bits);
  dVar4 = estimate_modexp_cost(bits);
  PVar3 = progress_add_probabilistic
                    (prog,(double)uVar2 * dVar4,dVar1 / ((double)bits * 0.6931471805599453));
  return (ProgressPhase)PVar3.p;
}

Assistant:

static ProgressPhase probprime_add_progress_phase(
    const PrimeGenerationPolicy *policy,
    ProgressReceiver *prog, unsigned bits)
{
    /*
     * The density of primes near x is 1/(log x). When x is about 2^b,
     * that's 1/(b log 2).
     *
     * But we're only doing the expensive part of the process (the M-R
     * checks) for a number that passes the initial winnowing test of
     * having no factor less than 2^16 (at least, unless the prime is
     * so small that PrimeCandidateSource gives up on that winnowing).
     * The density of _those_ numbers is about 1/19.76. So the odds of
     * hitting a prime per expensive attempt are boosted by a factor
     * of 19.76.
     */
    const double log_2 = 0.693147180559945309417232121458;
    double winnow_factor = (bits < 32 ? 1.0 : 19.76);
    double prob = winnow_factor / (bits * log_2);

    /*
     * Estimate the cost of prime generation as the cost of the M-R
     * modexps.
     */
    double cost = (miller_rabin_checks_needed(bits) *
                   estimate_modexp_cost(bits));
    return progress_add_probabilistic(prog, cost, prob);
}